

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

uint32_t FAudioCreateReverb9WithCustomAllocatorEXT
                   (FAPO **ppApo,uint32_t Flags,FAudioMallocFunc customMalloc,
                   FAudioFreeFunc customFree,FAudioReallocFunc customRealloc)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  FAudioFXReverbParameters9 fxdefault;
  
  fxdefault._32_8_ = 0;
  fxdefault._40_5_ = 0x3f80000000;
  fxdefault._16_8_ = 0x9c40000408040808;
  fxdefault._24_8_ = 0x45;
  fxdefault.WetDryMix = 100.0;
  fxdefault.ReflectionsDelay = 5;
  fxdefault.ReverbDelay = '\x05';
  fxdefault.RearDelay = '\x05';
  fxdefault.SideDelay = '\x05';
  fxdefault.PositionLeft = '\x06';
  fxdefault.PositionRight = '\x06';
  fxdefault.PositionMatrixLeft = '\x1b';
  fxdefault.PositionMatrixRight = '\x1b';
  fxdefault.EarlyDiffusion = '\b';
  fxdefault.Density._0_3_ = 0xc80000;
  fxdefault._48_5_ = 0x42c8000042;
  fapo = (FAPOBase *)(*customMalloc)(0x18d0);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x9f);
  *(undefined1 *)((long)&fapo[1].base.Release + 4) = 9;
  SDL_memcpy(pParameterBlocks,&fxdefault,0x35);
  SDL_memcpy(pParameterBlocks + 0x35,&fxdefault,0x35);
  SDL_memcpy(pParameterBlocks + 0x6a,&fxdefault,0x35);
  SDL_memcpy(&ReverbProperties,&FAudioFX_CLSID_AudioReverb,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&ReverbProperties,pParameterBlocks,0x35,'\0',customMalloc,customFree,customRealloc
            );
  fapo[1].base.AddRef = (AddRefFunc)0x0;
  SDL_memset(&fapo[1].base.GetRegistrationProperties,0,0x17e0,customRealloc);
  (fapo->base).LockForProcess = FAudioFXReverb_LockForProcess;
  (fapo->base).IsInputFormatSupported = FAudioFXReverb_IsInputFormatSupported;
  (fapo->base).IsOutputFormatSupported = FAudioFXReverb_IsOutputFormatSupported;
  (fapo->base).Initialize = FAudioFXReverb_Initialize;
  (fapo->base).Reset = FAudioFXReverb_Reset;
  (fapo->base).Process = FAudioFXReverb_Process;
  fapo->Destructor = FAudioFXReverb_Free;
  *ppApo = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateReverb9WithCustomAllocatorEXT(
	FAPO** ppApo,
	uint32_t Flags,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	const FAudioFXReverbParameters9 fxdefault =
	{
		FAUDIOFX_REVERB_DEFAULT_WET_DRY_MIX,
		FAUDIOFX_REVERB_DEFAULT_REFLECTIONS_DELAY,
		FAUDIOFX_REVERB_DEFAULT_REVERB_DELAY,
		FAUDIOFX_REVERB_DEFAULT_REAR_DELAY, /* FIXME: 7POINT1? */
		FAUDIOFX_REVERB_DEFAULT_7POINT1_SIDE_DELAY,
		FAUDIOFX_REVERB_DEFAULT_POSITION,
		FAUDIOFX_REVERB_DEFAULT_POSITION,
		FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX,
		FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX,
		FAUDIOFX_REVERB_DEFAULT_EARLY_DIFFUSION,
		FAUDIOFX_REVERB_DEFAULT_LATE_DIFFUSION,
		FAUDIOFX_REVERB_DEFAULT_LOW_EQ_GAIN,
		FAUDIOFX_REVERB_DEFAULT_LOW_EQ_CUTOFF,
		FAUDIOFX_REVERB_DEFAULT_HIGH_EQ_GAIN,
		FAUDIOFX_REVERB_DEFAULT_HIGH_EQ_CUTOFF,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_FREQ,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_MAIN,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_HF,
		FAUDIOFX_REVERB_DEFAULT_REFLECTIONS_GAIN,
		FAUDIOFX_REVERB_DEFAULT_REVERB_GAIN,
		FAUDIOFX_REVERB_DEFAULT_DECAY_TIME,
		FAUDIOFX_REVERB_DEFAULT_DENSITY,
		FAUDIOFX_REVERB_DEFAULT_ROOM_SIZE
	};

	/* Allocate... */
	FAudioFXReverb *result = (FAudioFXReverb*) customMalloc(sizeof(FAudioFXReverb));
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAudioFXReverbParameters9) * 3
	);
	result->apiVersion = 9;
	#define INITPARAMS(offset) \
		FAudio_memcpy( \
			params + sizeof(FAudioFXReverbParameters9) * offset, \
			&fxdefault, \
			sizeof(FAudioFXReverbParameters9) \
		);
	INITPARAMS(0)
	INITPARAMS(1)
	INITPARAMS(2)
	#undef INITPARAMS

	/* Initialize... */
	FAudio_memcpy(
		&ReverbProperties.clsid,
		&FAudioFX_CLSID_AudioReverb,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		&ReverbProperties,
		params,
		sizeof(FAudioFXReverbParameters9),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	result->inChannels = 0;
	result->outChannels = 0;
	result->sampleRate = 0;
	FAudio_zero(&result->reverb, sizeof(DspReverb));

	/* Function table... */
	#define ASSIGN_VT(name) \
		result->base.base.name = (name##Func) FAudioFXReverb_##name;
	ASSIGN_VT(LockForProcess);
	ASSIGN_VT(IsInputFormatSupported);
	ASSIGN_VT(IsOutputFormatSupported);
	ASSIGN_VT(Initialize);
	ASSIGN_VT(Reset);
	ASSIGN_VT(Process);
	result->base.Destructor = FAudioFXReverb_Free;
	#undef ASSIGN_VT

	/* Finally. */
	*ppApo = &result->base.base;
	return 0;
}